

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void __thiscall
boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
mphf<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this,size_t n,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *input_range,int num_thread,
          double gamma,bool writeEach,bool progress,float perc_elem_loaded)

{
  pointer plVar1;
  reference pvVar2;
  undefined4 in_ECX;
  pointer in_RSI;
  ulong uVar3;
  vector<boomphf::level,_std::allocator<boomphf::level>_> *in_RDI;
  byte in_R8B;
  byte in_R9B;
  pointer in_XMM0_Qa;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 in_XMM1_Da;
  int ii;
  uint64_t offset;
  double total_fastmode_ram;
  double total_writeEach;
  double sum_geom_read;
  double total_raw;
  int in_stack_00000cf4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000cf8;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *in_stack_00000d00;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Progress *in_stack_ffffffffffffff00;
  pointer in_stack_ffffffffffffff08;
  Progress *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff20;
  __type in_stack_ffffffffffffff28;
  bitVector *this_00;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this_01;
  undefined1 local_88 [28];
  int local_6c;
  pointer local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined4 local_30;
  byte local_2a;
  byte local_29;
  pointer local_28;
  undefined4 local_1c;
  pointer local_10;
  
  local_29 = in_R8B & 1;
  local_2a = in_R9B & 1;
  local_30 = in_XMM1_Da;
  local_28 = in_XMM0_Qa;
  local_1c = in_ECX;
  local_10 = in_RSI;
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::vector
            ((vector<boomphf::level,_std::allocator<boomphf::level>_> *)0x10e608);
  XorshiftHashFunctors<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::
  XorshiftHashFunctors
            ((XorshiftHashFunctors<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)
             0x10e616);
  in_RDI[5].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  auVar5._8_4_ = (int)((ulong)local_10 >> 0x20);
  auVar5._0_8_ = local_10;
  auVar5._12_4_ = 0x45300000;
  dVar4 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) * (double)local_28
              );
  in_RDI[6].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)dVar4 | (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f);
  in_RDI[6].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_finish = local_10;
  std::
  unordered_map<unsigned_long,_unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)0x10e6bd);
  this_01 = (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)(in_RDI + 0xd);
  Progress::Progress(in_stack_ffffffffffffff00);
  *(undefined4 *)
   ((long)&in_RDI[0x14].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = local_1c;
  *(undefined4 *)
   &in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
    super__Vector_impl_data._M_finish = local_30;
  this_00 = (bitVector *)
            &in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10e70b);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x10e721);
  *(byte *)((long)&in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = local_2a & 1;
  if (local_10 != (pointer)0x0) {
    *(undefined1 *)
     ((long)&in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    if (0.0 < *(float *)&in_RDI[0x16].
                         super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl
                         .super__Vector_impl_data._M_finish) {
      *(undefined1 *)
       ((long)&in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
               _M_impl.super__Vector_impl_data._M_finish + 4) = 1;
    }
    if ((local_29 & 1) == 0) {
      *(undefined1 *)
       ((long)&in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 6) = 0;
    }
    else {
      *(undefined1 *)
       ((long)&in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 6) = 1;
      *(undefined1 *)
       ((long)&in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
               _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    }
    mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::setup(this_01);
    if (((ulong)in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100000000) != 0) {
      *(undefined4 *)
       &in_RDI[0xd].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
        super__Vector_impl_data._M_start = 1;
      local_48 = (double)*(int *)&in_RDI[1].
                                  super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
      local_50 = 1.0 / (1.0 - (double)in_RDI[0x14].
                                      super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_58 = local_50 + 1.0;
      in_stack_ffffffffffffff20 =
           (double)(*(int *)&in_RDI[0x18].
                             super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      in_stack_ffffffffffffff28 =
           std::pow<double,int>((double)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_60 = in_stack_ffffffffffffff28 *
                 (double)(int)(~*(uint *)&in_RDI[0x18].
                                          super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage +
                              *(int *)&in_RDI[1].
                                       super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                       ._M_impl.super__Vector_impl_data._M_start) +
                 in_stack_ffffffffffffff20;
      printf("for info, total work write each  : %.3f    total work inram from level %i : %.3f  total work raw : %.3f \n"
             ,local_58,local_60,local_48,
             (ulong)*(uint *)&in_RDI[0x18].
                              super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((local_29 & 1) == 0) {
        if (((ulong)in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                    ._M_impl.super__Vector_impl_data._M_finish & 0x100000000) == 0) {
          Progress::init((Progress *)(in_RDI + 0xd),
                         (EVP_PKEY_CTX *)
                         ((long)in_RDI[6].
                                super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                                _M_impl.super__Vector_impl_data._M_finish *
                         (long)*(int *)&in_RDI[1].
                                        super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
        }
        else {
          plVar1 = in_RDI[6].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          auVar7._8_4_ = (int)((ulong)plVar1 >> 0x20);
          auVar7._0_8_ = plVar1;
          auVar7._12_4_ = 0x45300000;
          dVar4 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)plVar1) - 4503599627370496.0)) * local_60;
          uVar3 = (ulong)dVar4;
          Progress::init((Progress *)(in_RDI + 0xd),
                         (EVP_PKEY_CTX *)
                         (uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f));
        }
      }
      else {
        plVar1 = in_RDI[6].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        auVar6._8_4_ = (int)((ulong)plVar1 >> 0x20);
        auVar6._0_8_ = plVar1;
        auVar6._12_4_ = 0x45300000;
        dVar4 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)plVar1) - 4503599627370496.0)) * local_58;
        uVar3 = (ulong)dVar4;
        Progress::init((Progress *)(in_RDI + 0xd),
                       (EVP_PKEY_CTX *)
                       (uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f));
      }
    }
    local_68 = (pointer)0x0;
    for (local_6c = 0;
        local_6c <
        *(int *)&in_RDI[1].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                 _M_impl.super__Vector_impl_data._M_start; local_6c = local_6c + 1) {
      plVar1 = (pointer)operator_new(0x30);
      std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                (in_RDI,(long)local_6c);
      bitVector::bitVector
                ((bitVector *)in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_RDI[5].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
      super__Vector_impl_data._M_finish = plVar1;
      processLevel<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                (in_stack_00000d00,in_stack_00000cf8,in_stack_00000cf4);
      pvVar2 = std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                         (in_RDI,(long)local_6c);
      in_stack_ffffffffffffff10 = (Progress *)&pvVar2->bitset;
      std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                (in_RDI,(long)local_6c);
      bitVector::clearCollisions
                (this_00,(uint64_t)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20,
                 (bitVector *)plVar1);
      std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                (in_RDI,(long)local_6c);
      in_stack_ffffffffffffff08 =
           (pointer)bitVector::build_ranks
                              ((bitVector *)in_stack_ffffffffffffff10,
                               (uint64_t)in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff00 =
           (Progress *)
           in_RDI[5].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_68 = in_stack_ffffffffffffff08;
      if (in_stack_ffffffffffffff00 != (Progress *)0x0) {
        bitVector::~bitVector((bitVector *)in_stack_ffffffffffffff00);
        operator_delete(in_stack_ffffffffffffff00);
      }
    }
    if (((ulong)in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100000000) != 0) {
      Progress::finish_threaded(in_stack_ffffffffffffff10);
    }
    in_RDI[0x15].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
    super__Vector_impl_data._M_start = local_68;
    memset(local_88,0,0x18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10ec1e);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::swap
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff08);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10);
    pthread_mutex_destroy
              ((pthread_mutex_t *)
               &in_RDI[0x19].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    *(undefined1 *)
     ((long)&in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 1;
  }
  return;
}

Assistant:

mphf( size_t n, Range const& input_range,int num_thread = 1,  double gamma = 2.0 , bool writeEach = true, bool progress =true, float perc_elem_loaded = 0.03) :
		_gamma(gamma), _hash_domain(size_t(ceil(double(n) * gamma))), _nelem(n), _num_thread(num_thread), _percent_elem_loaded_for_fastMode (perc_elem_loaded), _withprogress(progress)
		{
			if(n ==0) return;
			
			_fastmode = false;
			

			
			if(_percent_elem_loaded_for_fastMode > 0.0 )
				_fastmode =true;

			
			if(writeEach)
			{
				_writeEachLevel =true;
				_fastmode = false;
			}
			else
			{
				_writeEachLevel = false;
			}
			
			setup();

			if(_withprogress)
			{
				_progressBar.timer_mode=1;
				
				
				double total_raw = _nb_levels;
				
				double sum_geom_read =  ( 1.0 / (1.0 - _proba_collision));
				double total_writeEach = sum_geom_read + 1.0;

				double total_fastmode_ram =  (_fastModeLevel+1) +  ( pow(_proba_collision,_fastModeLevel)) * (_nb_levels-(_fastModeLevel+1))   ;
				
				printf("for info, total work write each  : %.3f    total work inram from level %i : %.3f  total work raw : %.3f \n",total_writeEach,_fastModeLevel,total_fastmode_ram,total_raw);

				if(writeEach)
				{
					_progressBar.init(_nelem * total_writeEach,"Building BooPHF",num_thread);
				}
				else if(_fastmode)
					_progressBar.init( _nelem * total_fastmode_ram    ,"Building BooPHF",num_thread);
				else
					_progressBar.init( _nelem * _nb_levels ,"Building BooPHF",num_thread);
			}

			uint64_t offset = 0;
			for(int ii = 0; ii< _nb_levels; ii++)
			{
				_tempBitset =  new bitVector(_levels[ii].hash_domain); // temp collision bitarray for this level

				processLevel(input_range,ii);

				_levels[ii].bitset.clearCollisions(0 , _levels[ii].hash_domain , _tempBitset);
				
				offset = _levels[ii].bitset.build_ranks(offset);

				delete _tempBitset;
			}

			if(_withprogress)
			_progressBar.finish_threaded();


			_lastbitsetrank = offset ;

			//printf("used temp ram for construction : %lli MB \n",setLevelFastmode.capacity()* sizeof(elem_t) /1024ULL/1024ULL);

			std::vector<elem_t>().swap(setLevelFastmode);   // clear setLevelFastmode reallocating


			pthread_mutex_destroy(&_mutex);
			
			_built = true;
		}